

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall bgui::BaseWindow::setInfoText(BaseWindow *this,char *text)

{
  size_t sVar1;
  long lVar2;
  char *in_RSI;
  long in_RDI;
  BaseWindowData *in_stack_000001f0;
  
  sVar1 = strlen(in_RSI);
  if ((sVar1 != 0) || (lVar2 = std::__cxx11::string::size(), lVar2 != 0)) {
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
    XPutImage(*(undefined8 *)(*(long *)(in_RDI + 8) + 8),
              *(undefined8 *)(*(long *)(in_RDI + 8) + 0x18),
              *(undefined8 *)(*(long *)(in_RDI + 8) + 0x30),
              *(undefined8 *)(*(long *)(in_RDI + 8) + 0x40),0,0,0,0,
              *(undefined4 *)(*(long *)(in_RDI + 8) + 0x48),
              *(undefined4 *)(*(long *)(in_RDI + 8) + 0x4c));
    std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 8) + 0x78),in_RSI);
    anon_unknown_0::drawInfoText(in_stack_000001f0);
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
  }
  return;
}

Assistant:

void BaseWindow::setInfoText(const char *text)
{
  if (strlen(text) == 0 && p->text.size() == 0)
  {
    return;
  }

  pthread_mutex_lock(&(p->mutex));

  // clear completely

  XPutImage(p->display, p->window, p->gc, p->image, 0, 0, 0, 0, p->w, p->h);

  // store text

  p->text=text;

  // draw text

  drawInfoText(p);

  pthread_mutex_unlock(&(p->mutex));
}